

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* google::GetLoggingDirectories_abi_cxx11_(void)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar1;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (logging_directories_list_abi_cxx11_ ==
      (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
    pvVar1 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)operator_new(0x18)
    ;
    *(undefined8 *)pvVar1 = 0;
    *(undefined8 *)(pvVar1 + 8) = 0;
    *(undefined8 *)(pvVar1 + 0x10) = 0;
    logging_directories_list_abi_cxx11_ = pvVar1;
    if (fLS::FLAGS_log_dir_abi_cxx11_[1] == 0) {
      GetTempDirectories((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)pvVar1);
      pvVar1 = logging_directories_list_abi_cxx11_;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"./",&local_29);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar1,&local_28);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,(char *)*fLS::FLAGS_log_dir_abi_cxx11_,&local_29);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(pvVar1,&local_28);
    }
    std::__cxx11::string::~string((string *)&local_28);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)logging_directories_list_abi_cxx11_;
}

Assistant:

const vector<string>& GetLoggingDirectories() {
  // Not strictly thread-safe but we're called early in InitGoogle().
  if (logging_directories_list == NULL) {
    logging_directories_list = new vector<string>;

    if ( !FLAGS_log_dir.empty() ) {
      // A dir was specified, we should use it
      logging_directories_list->push_back(FLAGS_log_dir.c_str());
    } else {
      GetTempDirectories(logging_directories_list);
#ifdef OS_WINDOWS
      char tmp[MAX_PATH];
      if (GetWindowsDirectoryA(tmp, MAX_PATH))
        logging_directories_list->push_back(tmp);
      logging_directories_list->push_back(".\\");
#else
      logging_directories_list->push_back("./");
#endif
    }
  }
  return *logging_directories_list;
}